

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cc
# Opt level: O3

void __thiscall muduo::Logger::Impl::finish(Impl *this)

{
  LogStream *pLVar1;
  char **ppcVar2;
  ulong uVar3;
  char *pcVar4;
  ulong __n;
  
  ppcVar2 = &(this->stream_).buffer_.cur_;
  pcVar4 = (this->stream_).buffer_.cur_;
  uVar3 = (long)ppcVar2 - (long)pcVar4;
  if ((uVar3 & 0xfffffffc) != 0) {
    pcVar4[2] = ' ';
    pcVar4[0] = ' ';
    pcVar4[1] = '-';
    pcVar4 = *ppcVar2 + 3;
    *ppcVar2 = pcVar4;
    uVar3 = (long)ppcVar2 - (long)pcVar4;
  }
  __n = (ulong)(this->basename_).size_;
  if (__n < (ulong)(long)(int)uVar3) {
    memcpy(pcVar4,(this->basename_).data_,__n);
    pcVar4 = (this->stream_).buffer_.cur_ + __n;
    (this->stream_).buffer_.cur_ = pcVar4;
    uVar3 = (long)ppcVar2 - (long)pcVar4;
  }
  if ((uVar3 & 0xfffffffe) != 0) {
    *pcVar4 = ':';
    *ppcVar2 = *ppcVar2 + 1;
  }
  pLVar1 = LogStream::operator<<(&this->stream_,this->line_);
  pcVar4 = (pLVar1->buffer_).cur_;
  ppcVar2 = &(pLVar1->buffer_).cur_;
  if (((int)ppcVar2 - (int)pcVar4 & 0xfffffffeU) != 0) {
    *pcVar4 = '\n';
    *ppcVar2 = *ppcVar2 + 1;
  }
  return;
}

Assistant:

void Logger::Impl::finish()
{
  stream_ << " - " << basename_ << ':' << line_ << '\n';
}